

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristics.cpp
# Opt level: O2

void __thiscall
Clasp::ClaspVsids_t<Clasp::DomScore>::updateVarActivity
          (ClaspVsids_t<Clasp::DomScore> *this,Solver *s,Var v,double f)

{
  double dVar1;
  pointer pDVar2;
  VarOrder *this_00;
  ulong k;
  double dVar3;
  double dVar4;
  double dVar5;
  
  if ((this->nant_ == false) ||
     ((v < (s->shared_->varInfo_).ebo_.size &&
      (((s->shared_->varInfo_).ebo_.buf[v].rep & 0x20) != 0)))) {
    k = (ulong)v;
    pDVar2 = (this->score_).ebo_.buf;
    dVar1 = pDVar2[k].super_VsidsScore.value;
    dVar4 = (double)(int)pDVar2[k].factor * f;
    if (this->acids_ == false) {
      dVar5 = dVar4 * this->inc_ + dVar1;
    }
    else if ((dVar4 != 1.0) || (NAN(dVar4))) {
      if ((dVar4 == 0.0) && (!NAN(dVar4))) {
        return;
      }
      dVar3 = (this->inc_ + dVar1 + dVar4) * 0.5;
      dVar5 = dVar4 + dVar1;
      if (dVar4 + dVar1 <= dVar3) {
        dVar5 = dVar3;
      }
    }
    else {
      dVar5 = (this->inc_ + dVar1) * 0.5;
    }
    pDVar2[k].super_VsidsScore.value = dVar5;
    if (1e+100 < dVar5) {
      normalize(this);
    }
    if ((v < (this->vars_).indices_.ebo_.size) &&
       (this_00 = &this->vars_, (this_00->indices_).ebo_.buf[k] != 0xffffffffffffffff)) {
      if (dVar5 < dVar1) {
        bk_lib::indexed_priority_queue<Clasp::ClaspVsids_t<Clasp::DomScore>::CmpScore>::decrease
                  (this_00,k);
        return;
      }
      bk_lib::indexed_priority_queue<Clasp::ClaspVsids_t<Clasp::DomScore>::CmpScore>::increase
                (this_00,k);
      return;
    }
  }
  return;
}

Assistant:

void ClaspVsids_t<ScoreType>::updateVarActivity(const Solver& s, Var v, double f) {
	if (!nant_ || s.varInfo(v).nant()) {
		double o = score_[v].get(), n;
		f = ScoreType::applyFactor(score_, v, f);
		if      (!acids_)  { n = o + (f * inc_); }
		else if (f == 1.0) { n = (o + inc_) / 2.0; }
		else if (f != 0.0) { n = std::max( (o + inc_ + f) / 2.0, f + o ); }
		else               { return; }
		score_[v].set(n);
		if (n > 1e100) { normalize(); }
		if (vars_.is_in_queue(v)) {
			if (n >= o) { vars_.increase(v); }
			else        { vars_.decrease(v); }
		}
	}
}